

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_get_optional_asn1_uint64(CBS *cbs,uint64_t *out,CBS_ASN1_TAG tag,uint64_t default_value)

{
  int iVar1;
  size_t sVar2;
  int local_44;
  undefined1 local_40 [4];
  int present;
  CBS child;
  uint64_t default_value_local;
  CBS_ASN1_TAG tag_local;
  uint64_t *out_local;
  CBS *cbs_local;
  
  child.len = default_value;
  iVar1 = CBS_get_optional_asn1(cbs,(CBS *)local_40,&local_44,tag);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    if (local_44 == 0) {
      *out = child.len;
    }
    else {
      iVar1 = CBS_get_asn1_uint64((CBS *)local_40,out);
      if ((iVar1 == 0) || (sVar2 = CBS_len((CBS *)local_40), sVar2 != 0)) {
        return 0;
      }
    }
    cbs_local._4_4_ = 1;
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_get_optional_asn1_uint64(CBS *cbs, uint64_t *out, CBS_ASN1_TAG tag,
                                 uint64_t default_value) {
  CBS child;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    if (!CBS_get_asn1_uint64(&child, out) || CBS_len(&child) != 0) {
      return 0;
    }
  } else {
    *out = default_value;
  }
  return 1;
}